

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O2

unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> __thiscall
duckdb::Binder::BindPivot
          (Binder *this,PivotRef *ref,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *all_columns)

{
  string *name;
  vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> *this_00;
  pointer puVar1;
  ClientContext *pCVar2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  size_type sVar5;
  pointer pPVar6;
  long *plVar7;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var8;
  pointer pVVar9;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var10;
  _func_int **pp_Var11;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var12;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  __buckets_ptr pp_Var16;
  pointer prVar17;
  bool bVar18;
  int iVar19;
  pointer pPVar20;
  type pPVar21;
  TypeCatalogEntry *pTVar22;
  idx_t iVar23;
  reference pvVar24;
  iterator iVar25;
  ClientConfig *pCVar26;
  pointer pSVar27;
  reference pvVar28;
  FunctionExpression *pFVar29;
  pointer pSVar30;
  pointer pSVar31;
  reference pvVar32;
  pointer pCVar33;
  pointer pFVar34;
  pointer pPVar35;
  BinderException *pBVar36;
  undefined8 *in_RCX;
  pointer pPVar37;
  Value *val;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *pivot_name;
  pointer puVar38;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar39
  ;
  ulong uVar40;
  pointer *__ptr;
  long lVar41;
  long lVar42;
  unsigned_long uVar43;
  iterator __begin1;
  pointer prVar44;
  size_type __n;
  pointer pVVar45;
  uint64_t value;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_358;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_350;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range2;
  PivotRef *local_340;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_338;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_330;
  pointer local_328;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_320;
  LogicalType local_318;
  string enum_value;
  value_set_t pivots;
  vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> aggregates;
  ulong local_260;
  ParsedExpression *local_250;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_248;
  __uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> local_240;
  string error_str;
  undefined1 local_218 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  pointer local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_1f0;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_1d8;
  pointer local_1b8;
  undefined8 *local_1b0;
  vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> pivot_aggregates;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_190;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_178;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_158;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_138;
  case_insensitive_set_t handled_columns;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_60 [24];
  LogicalType local_48;
  
  handled_columns._M_h._M_buckets = &handled_columns._M_h._M_single_bucket;
  handled_columns._M_h._M_bucket_count = 1;
  handled_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  handled_columns._M_h._M_element_count = 0;
  handled_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  handled_columns._M_h._M_rehash_policy._M_next_resize = 0;
  handled_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pivot_aggregates.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pivot_aggregates.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pivot_aggregates.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = all_columns[5].
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_340 = (PivotRef *)all_columns;
  local_240._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
  super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl =
       (tuple<duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>)
       (tuple<duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>)this;
  local_1b0 = in_RCX;
  for (puVar38 = all_columns[4].
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      prVar17 = pivot_aggregates.
                super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                ._M_impl.super__Vector_impl_data._M_finish, puVar38 != puVar1; puVar38 = puVar38 + 1
      ) {
    pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(puVar38);
    iVar19 = (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[4])(pPVar20);
    if ((char)iVar19 != '\0') {
      pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
      pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar38);
      ::std::__cxx11::string::string
                ((string *)&error_str,"Pivot expression cannot contain subqueries",
                 (allocator *)&enum_value);
      BinderException::BinderException<>(pBVar36,pPVar21,&error_str);
      __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(puVar38);
    iVar19 = (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[3])(pPVar20);
    if ((char)iVar19 != '\0') {
      pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
      pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar38);
      ::std::__cxx11::string::string
                ((string *)&error_str,"Pivot expression cannot contain window functions",
                 (allocator *)&enum_value);
      BinderException::BinderException<>(pBVar36,pPVar21,&error_str);
      __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar41 = (long)pivot_aggregates.
                   super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)pivot_aggregates.
                   super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p;
    pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(puVar38);
    ExtractPivotAggregateExpression(pCVar2,pPVar21,&pivot_aggregates);
    lVar41 = lVar41 >> 3;
    lVar42 = (long)pivot_aggregates.
                   super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)pivot_aggregates.
                   super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (lVar42 != lVar41 + 1) {
      uVar43 = lVar42 - lVar41;
      if (uVar43 == 0) {
        ::std::__cxx11::string::string
                  ((string *)&error_str,"but no aggregates were found",(allocator *)&enum_value);
      }
      else {
        ::std::__cxx11::to_string((string *)&pivots,uVar43);
        ::std::operator+(&enum_value,"but ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pivots);
        ::std::operator+(&error_str,&enum_value," were found");
        ::std::__cxx11::string::~string((string *)&enum_value);
        ::std::__cxx11::string::~string((string *)&pivots);
      }
      pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
      pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar38);
      ::std::__cxx11::string::string
                ((string *)&enum_value,"Pivot expression must contain exactly one aggregate, %s",
                 (allocator *)&pivots);
      ::std::__cxx11::string::string((string *)&local_80,(string *)&error_str);
      BinderException::BinderException<std::__cxx11::string>(pBVar36,pPVar21,&enum_value,&local_80);
      __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  for (prVar44 = pivot_aggregates.
                 super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; prVar44 != prVar17;
      prVar44 = prVar44 + 1) {
    ExtractPivotExpressions(&prVar44->_M_data->super_ParsedExpression,&handled_columns);
  }
  pPVar37 = (local_340->pivots).
            super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
            super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1b8 = (local_340->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_260 = 1;
  while (pPVar37 != local_1b8) {
    __range2 = &pPVar37->pivot_expressions;
    if ((pPVar37->pivot_enum)._M_string_length != 0) {
      pCVar2 = (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p;
      ::std::__cxx11::string::string
                ((string *)&error_str,anon_var_dwarf_4b71df5 + 9,(allocator *)&pivots._M_h);
      ::std::__cxx11::string::string
                ((string *)&enum_value,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_318);
      name = (string *)(__range2 + 3);
      pTVar22 = Catalog::GetEntry<duckdb::TypeCatalogEntry>
                          (pCVar2,&error_str,&enum_value,name,(QueryErrorContext)0xffffffffffffffff)
      ;
      ::std::__cxx11::string::~string((string *)&enum_value);
      ::std::__cxx11::string::~string((string *)&error_str);
      LogicalType::LogicalType((LogicalType *)&pivots._M_h,&pTVar22->user_type);
      if ((char)pivots._M_h._M_buckets != 'h') {
        pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&error_str,
                   "Pivot must reference an ENUM type: \"%s\" is of type \"%s\"",
                   (allocator *)&enum_value);
        ::std::__cxx11::string::string((string *)&local_a0,(string *)name);
        LogicalType::ToString_abi_cxx11_(&local_c0,(LogicalType *)&pivots);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (pBVar36,&local_340->super_TableRef,&error_str,&local_a0,&local_c0);
        __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar18 = LogicalType::IsComplete((LogicalType *)&pivots._M_h);
      if (!bVar18) {
        pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&error_str,"ENUM type is incomplete",(allocator *)&enum_value);
        BinderException::BinderException(pBVar36,&error_str);
        __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar23 = EnumType::GetSize((LogicalType *)&pivots._M_h);
      this_00 = (vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> *)
                (__range2 + 2);
      for (value = 0; iVar23 != value; value = value + 1) {
        Value::ENUM((Value *)&error_str,value,(LogicalType *)&pivots._M_h);
        EnumType::GetValue_abi_cxx11_(&enum_value,(EnumType *)&error_str,val);
        Value::~Value((Value *)&error_str);
        error_str.field_2._M_allocated_capacity = 0;
        error_str.field_2._8_8_ = 0;
        error_str._M_dataplus._M_p = (pointer)0x0;
        error_str._M_string_length = 0;
        local_218._0_8_ = local_208;
        local_218._8_8_ = 0;
        local_208 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      [8])((ulong)local_208 & 0xffffffffffffff00);
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&error_str,&enum_value);
        ::std::__cxx11::string::operator=((string *)local_218,(string *)&enum_value);
        ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::
        emplace_back<duckdb::PivotColumnEntry>(this_00,(PivotColumnEntry *)&error_str);
        PivotColumnEntry::~PivotColumnEntry((PivotColumnEntry *)&error_str);
        ::std::__cxx11::string::~string((string *)&enum_value);
      }
      LogicalType::~LogicalType((LogicalType *)&pivots._M_h);
    }
    local_260 = local_260 *
                ((long)__range2[2].
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)__range2[2].
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
    puVar3 = (__range2->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar39 = (__range2->
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar39 != puVar3;
        puVar39 = puVar39 + 1) {
      pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar39);
      ExtractPivotExpressions(pPVar21,&handled_columns);
    }
    pivots._M_h._M_buckets = &pivots._M_h._M_single_bucket;
    pivots._M_h._M_bucket_count = 1;
    pivots._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pivots._M_h._M_element_count = 0;
    pivots._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    pivots._M_h._M_rehash_policy._M_next_resize = 0;
    pivots._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_328 = (pointer)__range2[2].
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    for (pPVar37 = (pointer)__range2[2].
                            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; pPVar37 != local_328;
        pPVar37 = (pointer)&(pPVar37->entries).
                            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                            .
                            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      LogicalType::LogicalType(&local_48,SQLNULL);
      Value::Value((Value *)&error_str,&local_48);
      LogicalType::~LogicalType(&local_48);
      if ((long)(((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                 &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_finish -
          (long)(((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                 &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_start == 0x40) {
        pvVar24 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)pPVar37,0);
        Value::operator=((Value *)&error_str,pvVar24);
      }
      else {
        LogicalType::LogicalType(&local_318,VARCHAR);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                  (local_60,(vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)pPVar37);
        Value::LIST((Value *)&enum_value,&local_318,(vector<duckdb::Value,_true> *)local_60);
        Value::operator=((Value *)&error_str,(Value *)&enum_value);
        Value::~Value((Value *)&enum_value);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_60);
        LogicalType::~LogicalType(&local_318);
      }
      iVar25 = ::std::
               _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&pivots._M_h,(Value *)&error_str);
      if (iVar25.super__Node_iterator_base<duckdb::Value,_true>._M_cur != (__node_type *)0x0) {
        pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&enum_value,
                   "The value \"%s\" was specified multiple times in the IN clause",
                   (allocator *)&local_318);
        Value::ToString_abi_cxx11_(&local_e0,(Value *)&error_str);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar36,&local_340->super_TableRef,&enum_value,&local_e0);
        __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((long)(((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                 &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_finish -
          (long)(((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                 &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_start >> 6 !=
          (long)(__range2->
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(__range2->
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) {
        pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&enum_value,
                   "PIVOT IN list - inconsistent amount of rows - expected %d but got %d",
                   (allocator *)&local_318);
        BinderException::BinderException<unsigned_long,unsigned_long>
                  (pBVar36,&local_340->super_TableRef,&enum_value,
                   (long)(__range2->
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__range2->
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (long)(((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                          &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_finish -
                   (long)(((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                          &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_start >>
                   6);
        __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__detail::
      _Insert_base<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&pivots._M_h,(Value *)&error_str);
      Value::~Value((Value *)&error_str);
    }
    ::std::
    _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&pivots._M_h);
    pPVar37 = (pointer)&__range2[4].
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  pCVar26 = ClientConfig::GetConfig((ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
  if (pCVar26->pivot_limit <= local_260) {
    pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&error_str,
               "Pivot column limit of %llu exceeded. Use SET pivot_limit=X to increase the limit.",
               (allocator *)&enum_value);
    BinderException::BinderException<unsigned_long>
              (pBVar36,&local_340->super_TableRef,&error_str,pCVar26->pivot_limit);
    __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_1d8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  error_str.field_2._8_8_ = local_218 + 8;
  error_str.field_2._M_allocated_capacity = 0;
  local_208 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                [8])0x0;
  local_218._0_8_ = 0;
  error_str._M_dataplus._M_p = (pointer)0x0;
  error_str._M_string_length = 0;
  local_218._8_8_ = 0;
  ConstructPivots(local_340,(vector<duckdb::PivotValueElement,_true> *)&local_1d8,0,
                  (PivotValueElement *)&error_str);
  PivotValueElement::~PivotValueElement((PivotValueElement *)&error_str);
  ((QueryNode *)
  local_240._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
  super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl)->_vptr_QueryNode =
       (_func_int **)0x0;
  if (pCVar26->pivot_filter_threshold <
      (ulong)(((long)local_1d8.
                     super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x38)) {
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8 = (pointer)0x0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  [8])0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218._0_8_ = 0;
    local_218._8_8_ = 0;
    error_str.field_2._M_allocated_capacity = 0;
    error_str.field_2._8_8_ = 0;
    error_str._M_dataplus._M_p = (pointer)0x0;
    error_str._M_string_length = 0;
    local_318.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0[2];
    local_318._0_8_ = *local_1b0;
    local_318.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1b0[1];
    local_1b0[2] = 0;
    *local_1b0 = 0;
    local_1b0[1] = 0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstructInitialGrouping
              ((duckdb *)&local_320,local_340,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_318,&handled_columns);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_318);
    pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_320);
    puVar1 = (pSVar27->select_list).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar43 = 0;
    for (puVar38 = (pSVar27->select_list).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar38 != puVar1;
        puVar38 = puVar38 + 1) {
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar38);
      (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[7])(&enum_value,pPVar20);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (error_str.field_2._M_local_buf + 8),&enum_value);
      ::std::__cxx11::string::~string((string *)&enum_value);
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar38);
      if ((pPVar20->super_BaseExpression).alias._M_string_length == 0) {
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar38);
        uVar43 = uVar43 + 1;
        ::std::__cxx11::to_string((string *)&pivots,uVar43);
        ::std::operator+(&enum_value,"__internal_pivot_group",(string *)&pivots);
        ::std::__cxx11::string::operator=
                  ((string *)&(pPVar20->super_BaseExpression).alias,(string *)&enum_value);
        ::std::__cxx11::string::~string((string *)&enum_value);
        ::std::__cxx11::string::~string((string *)&pivots);
      }
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar38);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error_str,&(pPVar20->super_BaseExpression).alias);
    }
    pPVar6 = (local_340->pivots).
             super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
             super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar43 = 0;
    pPVar37 = (local_340->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pPVar37 != pPVar6) {
      __range2 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)(pPVar37->pivot_expressions).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_328 = pPVar37;
      for (pVVar45 = (pointer)(pPVar37->pivot_expressions).
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
          pVVar45 != (pointer)__range2; pVVar45 = (pointer)&(pVVar45->type_).type_info_) {
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)pVVar45);
        if ((pPVar20->super_BaseExpression).alias._M_string_length == 0) {
          pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)pVVar45);
          uVar43 = uVar43 + 1;
          ::std::__cxx11::to_string((string *)&pivots,uVar43);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &enum_value,"__internal_pivot_ref",(string *)&pivots);
          ::std::__cxx11::string::operator=
                    ((string *)&(pPVar20->super_BaseExpression).alias,(string *)&enum_value);
          ::std::__cxx11::string::~string((string *)&enum_value);
          ::std::__cxx11::string::~string((string *)&pivots);
        }
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)pVVar45);
        ::std::__cxx11::string::string
                  ((string *)&pivots,(string *)&(pPVar20->super_BaseExpression).alias);
        pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_320);
        pSVar30 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_320);
        Value::INTEGER((Value *)&enum_value,
                       (int)((ulong)((long)(pSVar30->select_list).
                                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                           .
                                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pSVar30->select_list).
                                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
        make_uniq<duckdb::ConstantExpression,duckdb::Value>
                  ((duckdb *)&local_358,(Value *)&enum_value);
        aggregates.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_358._M_head_impl;
        local_358._M_head_impl = (ParsedExpression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar27->groups,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&aggregates);
        if (aggregates.
            super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)&((aggregates.
                         super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                         .
                         super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_data->super_ParsedExpression
                       ).super_BaseExpression.type)();
        }
        aggregates.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (local_358._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_358._M_head_impl = (ParsedExpression *)0x0;
        Value::~Value((Value *)&enum_value);
        pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_320);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar27->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)pVVar45);
        make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string>
                  ((duckdb *)&enum_value,(string *)&pivots);
        _Var15 = enum_value._M_dataplus;
        enum_value._M_dataplus._M_p = (pointer)0x0;
        plVar7 = *(long **)&pVVar45->type_;
        *(pointer *)&pVVar45->type_ = _Var15._M_p;
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 8))();
        }
        if (enum_value._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)enum_value._M_dataplus._M_p + 8))();
        }
        ::std::__cxx11::string::~string((string *)&pivots);
      }
      pPVar37 = local_328 + 1;
    }
    puVar3 = (local_340->aggregates).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar43 = 1;
    for (puVar39 = (local_340->aggregates).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar39 != puVar3;
        puVar39 = puVar39 + 1) {
      ::std::__cxx11::to_string((string *)&pivots,uVar43);
      ::std::operator+(&enum_value,"__internal_pivot_aggregate",(string *)&pivots);
      ::std::__cxx11::string::~string((string *)&pivots);
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar39);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_208,&(pPVar20->super_BaseExpression).alias);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&vStack_1f0,&enum_value);
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar39);
      ::std::__cxx11::string::operator=
                ((string *)&(pPVar20->super_BaseExpression).alias,(string *)&enum_value);
      pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_320);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar27->select_list,puVar39);
      ::std::__cxx11::string::~string((string *)&enum_value);
      uVar43 = uVar43 + 1;
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_158);
    _Var12._M_head_impl = local_320._M_head_impl;
    local_320._M_head_impl = (SelectNode *)0x0;
    make_uniq<duckdb::SelectNode>();
    make_uniq<duckdb::SelectStatement>();
    pSVar31 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_318);
    _Var8._M_head_impl =
         (pSVar31->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar31->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
         &(_Var12._M_head_impl)->super_QueryNode;
    if (_Var8._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var8._M_head_impl)->_vptr_QueryNode + 8))();
    }
    make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
              ((duckdb *)&aggregates,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)&local_318);
    for (uVar40 = 0;
        uVar40 < (ulong)((long)(error_str._M_string_length - (long)error_str._M_dataplus._M_p) >> 5)
        ; uVar40 = uVar40 + 1) {
      pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_330);
      pSVar30 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_330);
      Value::INTEGER((Value *)&enum_value,
                     (int)((ulong)((long)(pSVar30->select_list).
                                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                         .
                                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pSVar30->select_list).
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
      make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_358,(Value *)&enum_value)
      ;
      pivots._M_h._M_buckets = (__buckets_ptr)local_358._M_head_impl;
      local_358._M_head_impl = (ParsedExpression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar27->groups,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&pivots);
      if (pivots._M_h._M_buckets != (__buckets_ptr)0x0) {
        (*(code *)(*pivots._M_h._M_buckets)[1]._M_nxt)();
      }
      pivots._M_h._M_buckets = (__buckets_ptr)0x0;
      if (local_358._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_358._M_head_impl = (ParsedExpression *)0x0;
      Value::~Value((Value *)&enum_value);
      pvVar32 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)&error_str,uVar40);
      make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>((duckdb *)&enum_value,pvVar32);
      pCVar33 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                              *)&enum_value);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *)&error_str,uVar40);
      ::std::__cxx11::string::_M_assign
                ((string *)&(pCVar33->super_ParsedExpression).super_BaseExpression.alias);
      pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_330);
      pivots._M_h._M_buckets = (__buckets_ptr)enum_value._M_dataplus;
      enum_value._M_dataplus._M_p = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar27->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&pivots);
      if (pivots._M_h._M_buckets != (__buckets_ptr)0x0) {
        (*(code *)(*pivots._M_h._M_buckets)[1]._M_nxt)();
      }
      if (enum_value._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)enum_value._M_dataplus._M_p + 8))();
      }
    }
    for (uVar40 = 0;
        uVar40 < (ulong)((long)vStack_1f0.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vStack_1f0.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar40 = uVar40 + 1)
    {
      pvVar32 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(&vStack_1f0,uVar40);
      make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>((duckdb *)&pivots,pvVar32);
      local_358._M_head_impl = (ParsedExpression *)pivots._M_h._M_buckets;
      enum_value._M_dataplus._M_p = (pointer)0x0;
      enum_value._M_string_length = 0;
      enum_value.field_2._M_allocated_capacity = 0;
      pivots._M_h._M_buckets = (__buckets_ptr)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&enum_value,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_358);
      if (local_358._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)&(((FunctionExpression *)
                      ((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                     super_ParsedExpression).super_BaseExpression.type)();
      }
      make_uniq<duckdb::FunctionExpression,char_const(&)[5],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((duckdb *)&local_358,(char (*) [5])0x10699c9,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&enum_value);
      pFVar34 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                              *)&local_358);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::get<true>(&vStack_1f0,uVar40);
      ::std::__cxx11::string::_M_assign
                ((string *)&(pFVar34->super_ParsedExpression).super_BaseExpression.alias);
      pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_330);
      local_350._M_head_impl = local_358._M_head_impl;
      local_358._M_head_impl = (ParsedExpression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar27->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_350);
      if (local_350._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)&(((FunctionExpression *)
                      ((local_350._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                     super_ParsedExpression).super_BaseExpression.type)();
      }
      if (local_358._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)&(((FunctionExpression *)
                      ((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                     super_ParsedExpression).super_BaseExpression.type)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&enum_value);
      if (pivots._M_h._M_buckets != (__buckets_ptr)0x0) {
        (*(code *)(*pivots._M_h._M_buckets)[1]._M_nxt)();
      }
    }
    local_358._M_head_impl = (ParsedExpression *)0x0;
    local_328 = (local_340->pivots).
                super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    pPVar37 = (local_340->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pPVar37 != local_328) {
      pVVar9 = (((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_finish;
      pVVar45 = (((_Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                 &pPVar37->pivot_expressions)->_M_impl).super__Vector_impl_data._M_start;
      __range2 = &pPVar37->pivot_expressions;
      for (; pVVar45 != pVVar9; pVVar45 = (pointer)&(pVVar45->type_).type_info_) {
        local_338._M_head_impl = *(SelectNode **)&pVVar45->type_;
        (pVVar45->type_).id_ = INVALID;
        (pVVar45->type_).physical_type_ = ~INVALID;
        *(undefined6 *)&(pVVar45->type_).field_0x2 = 0;
        ConstructPivotExpression
                  ((duckdb *)&local_350,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_338);
        if (local_338._M_head_impl != (SelectNode *)0x0) {
          (*((local_338._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
        }
        local_338._M_head_impl = (SelectNode *)0x0;
        if (local_358._M_head_impl == (ParsedExpression *)0x0) {
          local_358._M_head_impl = local_350._M_head_impl;
        }
        else {
          pivots._M_h._M_buckets = (__buckets_ptr)0x0;
          pivots._M_h._M_bucket_count = 0;
          pivots._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pivots,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_358);
          Value::Value((Value *)&enum_value,"_");
          make_uniq<duckdb::ConstantExpression,duckdb::Value>
                    ((duckdb *)&local_250,(Value *)&enum_value);
          local_248._M_head_impl = local_250;
          local_250 = (ParsedExpression *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pivots,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_248);
          if (local_248._M_head_impl != (ParsedExpression *)0x0) {
            (*((local_248._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_248._M_head_impl = (ParsedExpression *)0x0;
          if (local_250 != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
          local_250 = (ParsedExpression *)0x0;
          Value::~Value((Value *)&enum_value);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pivots,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_350);
          make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                    ((duckdb *)&enum_value,(char (*) [7])0x1070fe1,
                     (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)&pivots);
          _Var15 = enum_value._M_dataplus;
          _Var4._M_head_impl = local_358._M_head_impl;
          enum_value._M_dataplus._M_p = (pointer)0x0;
          local_358._M_head_impl = (ParsedExpression *)_Var15._M_p;
          if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)&(((FunctionExpression *)
                          ((_Var4._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                         super_ParsedExpression).super_BaseExpression.type)();
            if (enum_value._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)enum_value._M_dataplus._M_p + 8))();
            }
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)&pivots);
          if (local_350._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)&(((FunctionExpression *)
                          ((local_350._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                         super_ParsedExpression).super_BaseExpression.type)();
          }
        }
      }
      pPVar37 = (pointer)&__range2[4].
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    pivots._M_h._M_buckets = (__buckets_ptr)0x0;
    pivots._M_h._M_bucket_count = 0;
    pivots._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pivots,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_358);
    make_uniq<duckdb::FunctionExpression,char_const(&)[5],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_350,(char (*) [5])0x10699c9,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&pivots);
    pFVar34 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&local_350);
    ::std::__cxx11::string::string
              ((string *)&enum_value,"__internal_pivot_name",(allocator *)&local_248);
    ::std::__cxx11::string::operator=
              ((string *)&(pFVar34->super_ParsedExpression).super_BaseExpression.alias,
               (string *)&enum_value);
    ::std::__cxx11::string::~string((string *)&enum_value);
    pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_330);
    enum_value._M_dataplus._M_p = (pointer)local_350._M_head_impl;
    local_350._M_head_impl = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar27->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&enum_value);
    if (enum_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)enum_value._M_dataplus._M_p + 8))();
    }
    prVar17 = aggregates.
              super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    aggregates.
    super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_330);
    _Var10._M_head_impl =
         (pSVar27->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar27->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)prVar17;
    if (_Var10._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var10._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (local_350._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_350._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&pivots);
    if (local_358._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)&(((FunctionExpression *)
                    ((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                   super_ParsedExpression).super_BaseExpression.type)();
    }
    if (aggregates.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((aggregates.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_data->super_ParsedExpression).
                   super_BaseExpression.type)();
    }
    if ((TableRef *)local_318._0_8_ != (TableRef *)0x0) {
      (*(*(_func_int ***)local_318._0_8_)[1])();
    }
    _Var13._M_head_impl = local_330._M_head_impl;
    local_330._M_head_impl = (QueryNode *)0x0;
    local_178.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_178.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_178.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    make_uniq<duckdb::SelectNode>();
    make_uniq<duckdb::SelectStatement>();
    pSVar31 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&enum_value);
    _Var8._M_head_impl =
         (pSVar31->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar31->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var13._M_head_impl;
    if (_Var8._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var8._M_head_impl)->_vptr_QueryNode + 8))();
    }
    make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
              ((duckdb *)&pivots,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)&enum_value);
    make_uniq<duckdb::PivotRef>();
    pPVar35 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_318);
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::
    _M_move_assign(&(pPVar35->bound_pivot_values).
                    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                   ,&local_178);
    pPVar35 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_318);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pPVar35->bound_group_names,(undefined1 *)((long)&error_str.field_2 + 8));
    pPVar35 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_318);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pPVar35->bound_aggregate_names,local_208);
    pp_Var16 = pivots._M_h._M_buckets;
    pivots._M_h._M_buckets = (__buckets_ptr)0x0;
    pPVar35 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&local_318);
    _Var10._M_head_impl =
         (pPVar35->source).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pPVar35->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)pp_Var16;
    if (_Var10._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var10._M_head_impl)->_vptr_TableRef + 8))();
    }
    pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_350);
    make_uniq<duckdb::StarExpression>();
    aggregates.
    super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_358._M_head_impl;
    local_358._M_head_impl = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar27->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&aggregates);
    if (aggregates.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((aggregates.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_data->super_ParsedExpression).
                   super_BaseExpression.type)();
    }
    aggregates.
    super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_358._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)&(((FunctionExpression *)
                    ((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                   super_ParsedExpression).super_BaseExpression.type)();
    }
    uVar14 = local_318._0_8_;
    local_318._0_8_ = (TableRef *)0x0;
    pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_350);
    _Var10._M_head_impl =
         (pSVar27->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar27->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar14;
    if (_Var10._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var10._M_head_impl)->_vptr_TableRef + 8))();
    }
    if ((TableRef *)local_318._0_8_ != (TableRef *)0x0) {
      (**(code **)((long)*(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)local_318._0_8_ + 8))();
    }
    if (pivots._M_h._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*pivots._M_h._M_buckets)[1]._M_nxt)();
    }
    if (enum_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)enum_value._M_dataplus._M_p + 8))();
    }
    ((QueryNode *)
    local_240._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl)->_vptr_QueryNode =
         (_func_int **)local_350._M_head_impl;
    local_350._M_head_impl = (ParsedExpression *)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              (&local_178);
    if (local_330._M_head_impl != (QueryNode *)0x0) {
      (*(local_330._M_head_impl)->_vptr_QueryNode[1])();
    }
    if (local_320._M_head_impl != (SelectNode *)0x0) {
      (*((local_320._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
    PivotBindState::~PivotBindState((PivotBindState *)&error_str);
  }
  else {
    pCVar2 = (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p;
    local_318.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0[2];
    local_318._0_8_ = *local_1b0;
    local_318.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1b0[1];
    local_1b0[2] = 0;
    *local_1b0 = 0;
    local_1b0[1] = 0;
    local_190.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_190.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_190.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstructInitialGrouping
              ((duckdb *)&local_338,local_340,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_318,&handled_columns);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_318);
    local_1b8 = (pointer)local_190.
                         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    for (__range2 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)local_190.
                       super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        _Var12._M_head_impl = local_338._M_head_impl, (pointer)__range2 != local_1b8;
        __range2 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&__range2[2].
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
      local_358._M_head_impl = (ParsedExpression *)0x0;
      pPVar37 = (local_340->pivots).
                super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      __n = 0;
      for (local_328 = (local_340->pivots).
                       super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                       super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                       ._M_impl.super__Vector_impl_data._M_start; local_328 != pPVar37;
          local_328 = local_328 + 1) {
        puVar3 = (local_328->pivot_expressions).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar39 = (local_328->pivot_expressions).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar39 != puVar3;
            puVar39 = puVar39 + 1) {
          pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(puVar39);
          (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[0xc])((Value *)&error_str,pPVar20);
          make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((duckdb *)&pivots,&LogicalType::VARCHAR,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&error_str);
          if (error_str._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)error_str._M_dataplus._M_p + 8))();
          }
          pvVar24 = vector<duckdb::Value,_true>::get<true>
                              ((vector<duckdb::Value,_true> *)__range2,__n);
          LogicalType::LogicalType((LogicalType *)&enum_value,VARCHAR);
          Value::DefaultCastAs((Value *)&error_str,pvVar24,(LogicalType *)&enum_value,false);
          make_uniq<duckdb::ConstantExpression,duckdb::Value>
                    ((duckdb *)&aggregates,(Value *)&error_str);
          Value::~Value((Value *)&error_str);
          LogicalType::~LogicalType((LogicalType *)&enum_value);
          enum_value._M_dataplus._M_p._0_1_ = 0x28;
          make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::CastExpression,std::default_delete<duckdb::CastExpression>,true>,duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                    ((duckdb *)&error_str,(ExpressionType *)&enum_value,
                     (unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                      *)&pivots,
                     (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                      *)&aggregates);
          if (local_358._M_head_impl == (ParsedExpression *)0x0) {
            local_358._M_head_impl = (ParsedExpression *)error_str._M_dataplus._M_p;
          }
          else {
            local_350._M_head_impl._0_1_ = 0x32;
            make_uniq<duckdb::ConjunctionExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ComparisonExpression,std::default_delete<duckdb::ComparisonExpression>,true>>
                      ((duckdb *)&enum_value,(ExpressionType *)&local_350,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_358,
                       (unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
                        *)&error_str);
            _Var15 = enum_value._M_dataplus;
            _Var4._M_head_impl = local_358._M_head_impl;
            enum_value._M_dataplus._M_p = (pointer)0x0;
            local_358._M_head_impl = (ParsedExpression *)_Var15._M_p;
            if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)&(((FunctionExpression *)
                            ((_Var4._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                           super_ParsedExpression).super_BaseExpression.type)();
              if (enum_value._M_dataplus._M_p != (pointer)0x0) {
                (**(code **)(*(long *)enum_value._M_dataplus._M_p + 8))();
              }
            }
            if (error_str._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)error_str._M_dataplus._M_p + 8))();
            }
          }
          if (aggregates.
              super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)&((aggregates.
                           super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_data->
                         super_ParsedExpression).super_BaseExpression.type)();
          }
          if (pivots._M_h._M_buckets != (__buckets_ptr)0x0) {
            (*(code *)(*pivots._M_h._M_buckets)[1]._M_nxt)();
          }
          __n = __n + 1;
        }
      }
      puVar3 = (local_340->aggregates).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_328 = (pointer)(__range2 + 1);
      for (puVar39 = (local_340->aggregates).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar39 != puVar3;
          puVar39 = puVar39 + 1) {
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar39);
        (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_350,pPVar20);
        aggregates.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        aggregates.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        aggregates.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&local_350);
        ExtractPivotAggregateExpression(pCVar2,pPVar21,&aggregates);
        pvVar28 = vector<std::reference_wrapper<duckdb::FunctionExpression>,_true>::get<true>
                            (&aggregates,0);
        pFVar29 = BaseExpression::Cast<duckdb::FunctionExpression>
                            ((BaseExpression *)pvVar28->_M_data);
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)&local_358);
        (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[0xc])((Value *)&error_str,pPVar20);
        _Var15 = error_str._M_dataplus;
        error_str._M_dataplus._M_p = (pointer)0x0;
        _Var4._M_head_impl =
             (pFVar29->filter).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pFVar29->filter).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)_Var15._M_p;
        if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
          if (error_str._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)error_str._M_dataplus._M_p + 8))();
          }
        }
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar39);
        ::std::__cxx11::string::string((string *)&error_str,(string *)local_328);
        sVar5 = (pPVar20->super_BaseExpression).alias._M_string_length;
        if ((ulong)((long)(local_340->aggregates).
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_340->aggregates).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 9) {
          if (sVar5 != 0) goto LAB_005fe9f6;
        }
        else {
          if (sVar5 == 0) {
            pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar39);
            (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[7])(&pivots,pPVar20);
          }
          else {
LAB_005fe9f6:
            ::std::__cxx11::string::string
                      ((string *)&pivots,(string *)&(pPVar20->super_BaseExpression).alias);
          }
          ::std::operator+(&enum_value,"_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pivots);
          ::std::__cxx11::string::append((string *)&error_str);
          ::std::__cxx11::string::~string((string *)&enum_value);
          ::std::__cxx11::string::~string((string *)&pivots);
        }
        pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)&local_350);
        ::std::__cxx11::string::_M_assign((string *)&(pPVar20->super_BaseExpression).alias);
        pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_338);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar27->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_350);
        ::std::__cxx11::string::~string((string *)&error_str);
        ::std::
        _Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                         *)&aggregates);
        if (local_350._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)&(((FunctionExpression *)
                        ((local_350._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                       super_ParsedExpression).super_BaseExpression.type)();
        }
      }
      if (local_358._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)&(((FunctionExpression *)
                      ((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                     super_ParsedExpression).super_BaseExpression.type)();
      }
    }
    local_338._M_head_impl = (SelectNode *)0x0;
    pp_Var11 = ((QueryNode *)
               local_240._M_t.
               super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>
               .super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl)->_vptr_QueryNode;
    ((QueryNode *)
    local_240._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl)->_vptr_QueryNode =
         (_func_int **)_Var12._M_head_impl;
    if (pp_Var11 != (_func_int **)0x0) {
      (**(code **)(*pp_Var11 + 8))();
      if (local_338._M_head_impl != (SelectNode *)0x0) {
        (*((local_338._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
    }
    local_338._M_head_impl = (SelectNode *)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              (&local_190);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_138);
  }
  ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
            (&local_1d8);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   *)&pivot_aggregates);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&handled_columns._M_h);
  return (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)
         (_Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>)
         local_240._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SelectNode> Binder::BindPivot(PivotRef &ref, vector<unique_ptr<ParsedExpression>> all_columns) {
	// keep track of the columns by which we pivot/aggregate
	// any columns which are not pivoted/aggregated on are added to the GROUP BY clause
	case_insensitive_set_t handled_columns;

	vector<reference<FunctionExpression>> pivot_aggregates;
	// parse the aggregate, and extract the referenced columns from the aggregate
	for (auto &aggr : ref.aggregates) {
		if (aggr->HasSubquery()) {
			throw BinderException(*aggr, "Pivot expression cannot contain subqueries");
		}
		if (aggr->IsWindow()) {
			throw BinderException(*aggr, "Pivot expression cannot contain window functions");
		}
		idx_t aggregate_count = pivot_aggregates.size();
		ExtractPivotAggregateExpression(context, *aggr, pivot_aggregates);
		if (pivot_aggregates.size() != aggregate_count + 1) {
			string error_str = pivot_aggregates.size() == aggregate_count
			                       ? "but no aggregates were found"
			                       : "but " + to_string(pivot_aggregates.size() - aggregate_count) + " were found";
			throw BinderException(*aggr, "Pivot expression must contain exactly one aggregate, %s", error_str);
		}
	}
	for (auto &aggr : pivot_aggregates) {
		ExtractPivotExpressions(aggr.get(), handled_columns);
	}

	// first add all pivots to the set of handled columns, and check for duplicates
	idx_t total_pivots = 1;
	for (auto &pivot : ref.pivots) {
		if (!pivot.pivot_enum.empty()) {
			auto &type_entry =
			    Catalog::GetEntry<TypeCatalogEntry>(context, INVALID_CATALOG, INVALID_SCHEMA, pivot.pivot_enum);
			auto type = type_entry.user_type;
			if (type.id() != LogicalTypeId::ENUM) {
				throw BinderException(ref, "Pivot must reference an ENUM type: \"%s\" is of type \"%s\"",
				                      pivot.pivot_enum, type.ToString());
			}
			if (!type.IsComplete()) {
				throw BinderException("ENUM type is incomplete");
			}
			auto enum_size = EnumType::GetSize(type);
			for (idx_t i = 0; i < enum_size; i++) {
				auto enum_value = EnumType::GetValue(Value::ENUM(i, type));
				PivotColumnEntry entry;
				entry.values.emplace_back(enum_value);
				entry.alias = std::move(enum_value);
				pivot.entries.push_back(std::move(entry));
			}
		}
		total_pivots *= pivot.entries.size();
		// add the pivoted column to the columns that have been handled
		for (auto &pivot_name : pivot.pivot_expressions) {
			ExtractPivotExpressions(*pivot_name, handled_columns);
		}
		value_set_t pivots;
		for (auto &entry : pivot.entries) {
			D_ASSERT(!entry.expr);
			Value val;
			if (entry.values.size() == 1) {
				val = entry.values[0];
			} else {
				val = Value::LIST(LogicalType::VARCHAR, entry.values);
			}
			if (pivots.find(val) != pivots.end()) {
				throw BinderException(ref, "The value \"%s\" was specified multiple times in the IN clause",
				                      val.ToString());
			}
			if (entry.values.size() != pivot.pivot_expressions.size()) {
				throw BinderException(ref, "PIVOT IN list - inconsistent amount of rows - expected %d but got %d",
				                      pivot.pivot_expressions.size(), entry.values.size());
			}
			pivots.insert(val);
		}
	}
	auto &client_config = ClientConfig::GetConfig(context);
	auto pivot_limit = client_config.pivot_limit;
	if (total_pivots >= pivot_limit) {
		throw BinderException(ref, "Pivot column limit of %llu exceeded. Use SET pivot_limit=X to increase the limit.",
		                      client_config.pivot_limit);
	}

	// construct the required pivot values recursively
	vector<PivotValueElement> pivot_values;
	ConstructPivots(ref, pivot_values);

	unique_ptr<SelectNode> pivot_node;
	// pivots have three components
	// - the pivots (i.e. future column names)
	// - the groups (i.e. the future row names
	// - the aggregates (i.e. the values of the pivot columns)

	// we have two ways of executing a pivot statement
	// (1) the straightforward manner of filtered aggregates SUM(..) FILTER (pivot_value=X)
	// (2) computing the aggregates once, then using LIST to group the aggregates together with the PIVOT operator
	// -> filtered aggregates are faster when there are FEW pivot values
	// -> LIST is faster when there are MANY pivot values
	// we switch dynamically based on the number of pivots to compute
	if (pivot_values.size() <= client_config.pivot_filter_threshold) {
		// use a set of filtered aggregates
		pivot_node =
		    PivotFilteredAggregate(context, ref, std::move(all_columns), handled_columns, std::move(pivot_values));
	} else {
		// executing a pivot statement happens in three stages
		// 1) execute the query "SELECT {groups}, {pivots}, {aggregates} FROM {from_clause} GROUP BY {groups}, {pivots}
		// this computes all values that are required in the final result, but not yet in the correct orientation
		// 2) execute the query "SELECT {groups}, LIST({pivots}), LIST({aggregates}) FROM [Q1] GROUP BY {groups}
		// this pushes all pivots and aggregates that belong to a specific group together in an aligned manner
		// 3) push a PIVOT operator, that performs the actual pivoting of the values into the different columns

		PivotBindState bind_state;
		// Pivot Stage 1
		// SELECT {groups}, {pivots}, {aggregates} FROM {from_clause} GROUP BY {groups}, {pivots}
		auto subquery_stage1 = PivotInitialAggregate(bind_state, ref, std::move(all_columns), handled_columns);

		// Pivot stage 2
		// SELECT {groups}, LIST({pivots}), LIST({aggregates}) FROM [Q1] GROUP BY {groups}
		auto subquery_stage2 = PivotListAggregate(bind_state, ref, std::move(subquery_stage1));

		// Pivot stage 3
		// construct the final pivot operator
		pivot_node = PivotFinalOperator(bind_state, ref, std::move(subquery_stage2), std::move(pivot_values));
	}
	return pivot_node;
}